

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O1

void __thiscall icu_63::OlsonTimeZone::deleteTransitionRules(OlsonTimeZone *this)

{
  long lVar1;
  
  if (this->initialRule != (InitialTimeZoneRule *)0x0) {
    (*(this->initialRule->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
  }
  if (this->firstTZTransition != (TimeZoneTransition *)0x0) {
    (*(this->firstTZTransition->super_UObject)._vptr_UObject[1])();
  }
  if (this->firstFinalTZTransition != (TimeZoneTransition *)0x0) {
    (*(this->firstFinalTZTransition->super_UObject)._vptr_UObject[1])();
  }
  if (this->finalZoneWithStartYear != (SimpleTimeZone *)0x0) {
    (*(this->finalZoneWithStartYear->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
      [1])();
  }
  if (this->historicRules != (TimeArrayTimeZoneRule **)0x0) {
    if (0 < this->historicRuleCount) {
      lVar1 = 0;
      do {
        if (this->historicRules[lVar1] != (TimeArrayTimeZoneRule *)0x0) {
          (*(this->historicRules[lVar1]->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < this->historicRuleCount);
    }
    uprv_free_63(this->historicRules);
  }
  this->finalZoneWithStartYear = (SimpleTimeZone *)0x0;
  this->firstTZTransitionIdx = 0;
  this->initialRule = (InitialTimeZoneRule *)0x0;
  this->firstTZTransition = (TimeZoneTransition *)0x0;
  this->historicRuleCount = 0;
  this->firstFinalTZTransition = (TimeZoneTransition *)0x0;
  this->historicRules = (TimeArrayTimeZoneRule **)0x0;
  LOCK();
  (this->transitionRulesInitOnce).fState.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  return;
}

Assistant:

void
OlsonTimeZone::deleteTransitionRules(void) {
    if (initialRule != NULL) {
        delete initialRule;
    }
    if (firstTZTransition != NULL) {
        delete firstTZTransition;
    }
    if (firstFinalTZTransition != NULL) {
        delete firstFinalTZTransition;
    }
    if (finalZoneWithStartYear != NULL) {
        delete finalZoneWithStartYear;
    }
    if (historicRules != NULL) {
        for (int i = 0; i < historicRuleCount; i++) {
            if (historicRules[i] != NULL) {
                delete historicRules[i];
            }
        }
        uprv_free(historicRules);
    }
    clearTransitionRules();
}